

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

void __thiscall QDockWidgetPrivate::startDrag(QDockWidgetPrivate *this,DragScope scope)

{
  uint uVar1;
  DragState *pDVar2;
  bool bVar3;
  DropAction DVar4;
  QMainWindow *mainWindow;
  QMainWindowLayout *this_00;
  QLayoutItem *pQVar5;
  QWidget *pQVar6;
  undefined **ppuVar7;
  QWidget *widget;
  
  if ((this->state != (DragState *)0x0) && (this->state->dragging == false)) {
    widget = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    pQVar6 = widget;
    do {
      pQVar6 = *(QWidget **)(*(long *)&pQVar6->field_0x8 + 0x10);
      if (pQVar6 == (QWidget *)0x0) {
        mainWindow = (QMainWindow *)0x0;
        break;
      }
      mainWindow = (QMainWindow *)QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
    } while (mainWindow == (QMainWindow *)0x0);
    if (mainWindow == (QMainWindow *)0x0) {
      this_00 = (QMainWindowLayout *)0x0;
    }
    else {
      this_00 = qt_mainwindow_layout(mainWindow);
    }
    uVar1 = (widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i;
    pQVar5 = QMainWindowLayout::unplug((QMainWindowLayout *)this_00,widget,scope);
    this->state->widgetItem = pQVar5;
    if (pQVar5 == (QLayoutItem *)0x0) {
      pQVar6 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
      if ((pQVar6 == (QWidget *)0x0) ||
         (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) {
        ppuVar7 = &PTR__QWidgetItem_008003f0;
      }
      else {
        ppuVar7 = &PTR__QWidgetItem_007fff88;
        widget = pQVar6;
      }
      pQVar5 = (QLayoutItem *)operator_new(0x18);
      (pQVar5->align).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
      pQVar5[1]._vptr_QLayoutItem = (_func_int **)widget;
      pQVar5->_vptr_QLayoutItem = (_func_int **)ppuVar7;
      pDVar2 = this->state;
      pDVar2->widgetItem = pQVar5;
      pDVar2->ownWidgetItem = true;
    }
    if (this->state->ctrlDrag == true) {
      QMainWindowLayout::restore((QMainWindowLayout *)this_00,false);
    }
    this->state->dragging = true;
    bVar3 = QMainWindowLayout::needsPlatformDrag();
    if (bVar3) {
      DVar4 = QMainWindowLayout::performPlatformWidgetDrag
                        ((QMainWindowLayout *)this_00,this->state->widgetItem,&this->state->pressPos
                        );
      if (DVar4 != IgnoreAction || (uVar1 & 1) != 0) {
        endDrag(this,LocationChange);
        return;
      }
      QMainWindowLayout::revert((QMainWindowLayout *)this_00,this->state->widgetItem);
      if (this->state != (DragState *)0x0) {
        operator_delete(this->state,0x30);
      }
      this->state = (DragState *)0x0;
    }
  }
  return;
}

Assistant:

void QDockWidgetPrivate::startDrag(DragScope scope)
{
    Q_Q(QDockWidget);

    if (state == nullptr || state->dragging)
        return;

    QMainWindowLayout *layout = qt_mainwindow_layout_from_dock(q);
    Q_ASSERT(layout != nullptr);

#if QT_CONFIG(draganddrop)
    bool wasFloating = q->isFloating();
#endif

    state->widgetItem = layout->unplug(q, scope);
    if (state->widgetItem == nullptr) {
        /*  Dock widget has a QMainWindow parent, but was never inserted with
            QMainWindow::addDockWidget, so the QMainWindowLayout has no
            widget item for it. It will be newly created and deleted if it doesn't
            get dropped into a dock area. */
        QDockWidgetGroupWindow *floatingTab = qobject_cast<QDockWidgetGroupWindow*>(parent);
        if (floatingTab && !q->isFloating())
            state->widgetItem = new QDockWidgetGroupWindowItem(floatingTab);
        else
            state->widgetItem = new QDockWidgetItem(q);
        state->ownWidgetItem = true;
    }

    if (state->ctrlDrag)
        layout->restore();

    state->dragging = true;

#if QT_CONFIG(draganddrop)
    if (QMainWindowLayout::needsPlatformDrag()) {
        Qt::DropAction result =
                layout->performPlatformWidgetDrag(state->widgetItem, state->pressPos);
        if (result == Qt::IgnoreAction && !wasFloating) {
            layout->revert(state->widgetItem);
            delete state;
            state = nullptr;
        } else {
            endDrag(QDockWidgetPrivate::EndDragMode::LocationChange);
        }
    }
#endif
}